

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void * thread_routine(void *arg_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  sigset_t signal_set;
  sigset_t sStack_98;
  
  iVar1 = sigfillset(&sStack_98);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/thread.cpp"
            ,0xfa);
    fflush(_stderr);
    zmq::zmq_abort(pcVar3);
  }
  iVar1 = pthread_sigmask(0,&sStack_98,(__sigset_t *)0x0);
  if (iVar1 != 0) {
    pcVar3 = strerror(iVar1);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/thread.cpp"
            ,0xfc);
    fflush(_stderr);
    zmq::zmq_abort(pcVar3);
  }
  zmq::thread_t::applySchedulingParameters((thread_t *)arg_);
  zmq::thread_t::applyThreadName((thread_t *)arg_);
  (**arg_)(*(undefined8 *)((long)arg_ + 8));
  return (void *)0x0;
}

Assistant:

static void *thread_routine (void *arg_)
{
#if !defined ZMQ_HAVE_OPENVMS && !defined ZMQ_HAVE_ANDROID
    //  Following code will guarantee more predictable latencies as it'll
    //  disallow any signal handling in the I/O thread.
    sigset_t signal_set;
    int rc = sigfillset (&signal_set);
    errno_assert (rc == 0);
    rc = pthread_sigmask (SIG_BLOCK, &signal_set, NULL);
    posix_assert (rc);
#endif
    zmq::thread_t *self = (zmq::thread_t *) arg_;
    self->applySchedulingParameters ();
    self->applyThreadName ();
    self->_tfn (self->_arg);
    return NULL;
}